

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCode
          (FBSCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  Status SVar4;
  string fbs;
  long *local_80;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = this->no_log_;
  GenerateFBS(&local_60,parser,filename,bVar1);
  if (local_60._M_string_length == 0) {
    SVar4 = ERROR;
  }
  else {
    if (bVar1 == false) {
      _GLOBAL__N_1::FBSCodeGenerator::GenerateCode();
    }
    std::operator+(&local_40,path,filename);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_70 = *plVar3;
      lStack_68 = plVar2[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar3;
      local_80 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    bVar1 = SaveFile((char *)local_80,local_60._M_dataplus._M_p,local_60._M_string_length,false);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    SVar4 = (Status)!bVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return SVar4;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateFBS(parser, path, filename, no_log_)) { return Status::ERROR; }
    return Status::OK;
  }